

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

void multipredict<true>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                       polyprediction *pred,bool finalize_predictions)

{
  uint64_t *puVar1;
  vw *all;
  polyprediction *ppVar2;
  size_t sVar3;
  float fVar4;
  multipredict_info<sparse_parameters> mp;
  multipredict_info<sparse_parameters> local_58;
  
  all = b->all;
  ppVar2 = pred;
  sVar3 = count;
  if (count != 0) {
    do {
      ppVar2->scalar = (ec->l).simple.initial;
      sVar3 = sVar3 - 1;
      ppVar2 = ppVar2 + 1;
    } while (sVar3 != 0);
  }
  local_58.count = count;
  local_58.step = step;
  local_58.pred = pred;
  if ((b->all->weights).sparse == false) {
    local_58.weights = (sparse_parameters *)&(all->weights).dense_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_58);
  }
  else {
    local_58.weights = &(all->weights).sparse_weights;
    local_58.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_58);
  }
  ppVar2 = pred;
  sVar3 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar2->scalar = (float)all->sd->contraction * ppVar2->scalar;
      sVar3 = sVar3 - 1;
      ppVar2 = ppVar2 + 1;
    } while (sVar3 != 0);
  }
  ppVar2 = pred;
  sVar3 = count;
  if (finalize_predictions && count != 0) {
    do {
      fVar4 = GD::finalize_prediction(all->sd,ppVar2->scalar);
      ppVar2->scalar = fVar4;
      sVar3 = sVar3 - 1;
      ppVar2 = ppVar2 + 1;
    } while (sVar3 != 0);
  }
  sVar3 = count;
  if (count != 0) {
    do {
      (ec->pred).scalar = pred->scalar;
      GD::print_audit_features(all,ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + step;
      pred = pred + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - step * count;
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}